

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O1

int i2cWriteByte(uint handle,uint bVal)

{
  FILE *__stream;
  int iVar1;
  
  __stream = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals >> 10 & 1) == 0)) {
    myTimeStamp();
    fprintf(__stream,"%s %s: handle=%d bVal=%d\n",myTimeStamp::buf,"i2cWriteByte",(ulong)handle,bVal
           );
  }
  if (libInitialised == '\0') {
    iVar1 = -0x1f;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cWriteByte_cold_1();
    }
  }
  else if (handle < 0x40) {
    if (i2cInfo[handle].state == 2) {
      if ((i2cInfo[handle].funcs & 0x40000) == 0) {
        iVar1 = -0x6b;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cWriteByte_cold_5();
        }
      }
      else if (bVal < 0x100) {
        iVar1 = my_smbus_access((int)i2cInfo[handle].fd,'\0',(uint8_t)bVal,1,(my_smbus_data *)0x0);
        if (((iVar1 < 0) && (iVar1 = -0x52, 3 < gpioCfg.dbgLevel)) &&
           ((gpioCfg.internals >> 10 & 1) == 0)) {
          i2cWriteByte_cold_3();
        }
      }
      else {
        iVar1 = -0x51;
        if ((gpioCfg.internals >> 10 & 1) == 0) {
          i2cWriteByte_cold_4();
        }
      }
    }
    else {
      iVar1 = -0x19;
      if ((gpioCfg.internals >> 10 & 1) == 0) {
        i2cWriteByte_cold_2();
      }
    }
  }
  else {
    iVar1 = -0x19;
    if ((gpioCfg.internals >> 10 & 1) == 0) {
      i2cWriteByte_cold_6();
    }
  }
  return iVar1;
}

Assistant:

int i2cWriteByte(unsigned handle, unsigned bVal)
{
   int status;

   DBG(DBG_USER, "handle=%d bVal=%d", handle, bVal);

   CHECK_INITED;

   if (handle >= PI_I2C_SLOTS)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if (i2cInfo[handle].state != PI_I2C_OPENED)
      SOFT_ERROR(PI_BAD_HANDLE, "bad handle (%d)", handle);

   if ((i2cInfo[handle].funcs & PI_I2C_FUNC_SMBUS_WRITE_BYTE) == 0)
      SOFT_ERROR(PI_BAD_SMBUS_CMD, "SMBUS command not supported by driver");

   if (bVal > 0xFF)
      SOFT_ERROR(PI_BAD_PARAM, "bad bVal (%d)", bVal);

   status = my_smbus_access(
            i2cInfo[handle].fd,
            PI_I2C_SMBUS_WRITE,
            bVal,
            PI_I2C_SMBUS_BYTE,
            NULL);

   if (status < 0)
   {
      DBG(DBG_USER, "error=%d (%m)", status);
      return PI_I2C_WRITE_FAILED;
   }

   return status;
}